

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

tm_conflict * http_gmtime(time_t timer,tm_conflict *tmbuf)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong local_78;
  size_t i_1;
  size_t i;
  undefined4 local_54;
  long local_30;
  ssize_t b;
  ssize_t a;
  tm_conflict *tmbuf_local;
  time_t timer_local;
  
  a = (ssize_t)tmbuf;
  tmbuf_local = (tm_conflict *)timer;
  if (timer < 0) {
    timer_local = (time_t)gmtime_r((time_t *)&tmbuf_local,(tm *)tmbuf);
  }
  else {
    memset(&i,0,0x38);
    local_54 = 0x46;
    memcpy(tmbuf,&i,0x38);
    iVar1 = (int)((long)tmbuf_local / 0x3c);
    *(int *)a = (int)tmbuf_local + iVar1 * -0x3c;
    local_30 = ((long)tmbuf_local / 0x3c) / 0x3c;
    iVar2 = (int)local_30;
    *(int *)(a + 4) = iVar1 + iVar2 * -0x3c;
    local_30 = local_30 / 0x18;
    *(int *)(a + 8) = iVar2 + (int)local_30 * -0x18;
    *(int *)(a + 0x18) = (int)((local_30 + 4) % 7);
    for (; lVar3 = local_30, 0x23ab0 < local_30; local_30 = local_30 + -0x23ab1) {
      *(int *)(a + 0x14) = *(int *)(a + 0x14) + 400;
    }
    while (local_30 = lVar3, 0x8eab < local_30) {
      *(int *)(a + 0x14) = *(int *)(a + 0x14) + 100;
      lVar3 = local_30 + -0x8eac;
      if ((*(int *)(a + 0x14) / 100 & 3U) == 0) {
        lVar3 = local_30 + -0x8ead;
      }
    }
    for (; 0x2da7 < local_30; local_30 = local_30 + -0x2da8) {
      *(int *)(a + 0x14) = *(int *)(a + 0x14) + 0x20;
    }
    for (; 0xb69 < local_30; local_30 = local_30 + -0xb6a) {
      *(int *)(a + 0x14) = *(int *)(a + 0x14) + 8;
    }
    for (; lVar3 = local_30, 0x5b4 < local_30; local_30 = local_30 + -0x5b5) {
      *(int *)(a + 0x14) = *(int *)(a + 0x14) + 4;
    }
    while (local_30 = lVar3, 0x16c < local_30) {
      *(int *)(a + 0x14) = *(int *)(a + 0x14) + 1;
      lVar3 = local_30 + -0x16d;
      if ((*(uint *)(a + 0x14) & 3) == 0) {
        if (local_30 + -0x16d < 1) {
          *(int *)(a + 0x14) = *(int *)(a + 0x14) + -1;
          break;
        }
        lVar3 = local_30 + -0x16e;
      }
    }
    local_30 = local_30 + 1;
    *(int *)(a + 0x1c) = (int)local_30;
    if ((*(uint *)(a + 0x14) & 3) == 1) {
      for (i_1 = 0; (i_1 < 0xc &&
                    ((long)(ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                                  [i_1] < local_30)); i_1 = i_1 + 1) {
        local_30 = local_30 -
                   (ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                          [i_1];
        *(int *)(a + 0x10) = *(int *)(a + 0x10) + 1;
      }
    }
    else {
      for (local_78 = 0xc;
          (local_78 < 0x18 &&
          ((long)(ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                        [local_78] < local_30)); local_78 = local_78 + 1) {
        local_30 = local_30 -
                   (ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                          [local_78];
        *(int *)(a + 0x10) = *(int *)(a + 0x10) + 1;
      }
    }
    *(int *)(a + 0xc) = (int)local_30;
    timer_local = a;
  }
  return (tm_conflict *)timer_local;
}

Assistant:

struct tm *http_gmtime(time_t timer, struct tm *tmbuf) {
  // static char* DAYS[] = {"Sun", "Mon", "Tue", "Wed", "Thu", "Fri",
  // "Sat"}; static char * Months = {  "Jan", "Feb", "Mar", "Apr", "May",
  // "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec"};
  static const uint8_t month_len[] = {
      31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31, // nonleap year
      31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31  // leap year
  };
  if (timer < 0)
    return gmtime_r(&timer, tmbuf);
  ssize_t a, b;
#if HAVE_TM_TM_ZONE
  *tmbuf = (struct tm){
      .tm_isdst = 0,
      .tm_year = 70, // tm_year == The number of years since 1900
      .tm_mon = 0,
      .tm_zone = "UTC",
  };
#else
  *tmbuf = (struct tm){
      .tm_isdst = 0,
      .tm_year = 70, // tm_year == The number of years since 1900
      .tm_mon = 0,
  };
#endif
  // for seconds up to weekdays, we build up, as small values clean up
  // larger values.
  a = (ssize_t)timer;
  b = a / 60;
  tmbuf->tm_sec = a - (b * 60);
  a = b / 60;
  tmbuf->tm_min = b - (a * 60);
  b = a / 24;
  tmbuf->tm_hour = a - (b * 24);
  // day of epoch was a thursday. Add + 4 so sunday == 0...
  tmbuf->tm_wday = (b + 4) % 7;
// tmp == number of days since epoch
#define DAYS_PER_400_YEARS ((400 * 365) + 97)
  while (b >= DAYS_PER_400_YEARS) {
    tmbuf->tm_year += 400;
    b -= DAYS_PER_400_YEARS;
  }
#undef DAYS_PER_400_YEARS
#define DAYS_PER_100_YEARS ((100 * 365) + 24)
  while (b >= DAYS_PER_100_YEARS) {
    tmbuf->tm_year += 100;
    b -= DAYS_PER_100_YEARS;
    if (((tmbuf->tm_year / 100) & 3) ==
        0) // leap century divisable by 400 => add leap
      --b;
  }
#undef DAYS_PER_100_YEARS
#define DAYS_PER_32_YEARS ((32 * 365) + 8)
  while (b >= DAYS_PER_32_YEARS) {
    tmbuf->tm_year += 32;
    b -= DAYS_PER_32_YEARS;
  }
#undef DAYS_PER_32_YEARS
#define DAYS_PER_8_YEARS ((8 * 365) + 2)
  while (b >= DAYS_PER_8_YEARS) {
    tmbuf->tm_year += 8;
    b -= DAYS_PER_8_YEARS;
  }
#undef DAYS_PER_8_YEARS
#define DAYS_PER_4_YEARS ((4 * 365) + 1)
  while (b >= DAYS_PER_4_YEARS) {
    tmbuf->tm_year += 4;
    b -= DAYS_PER_4_YEARS;
  }
#undef DAYS_PER_4_YEARS
  while (b >= 365) {
    tmbuf->tm_year += 1;
    b -= 365;
    if ((tmbuf->tm_year & 3) == 0) { // leap year
      if (b > 0) {
        --b;
        continue;
      } else {
        b += 365;
        --tmbuf->tm_year;
        break;
      }
    }
  }
  b++; /* day 1 of the year is 1, not 0. */
  tmbuf->tm_yday = b;
  if ((tmbuf->tm_year & 3) == 1) {
    // regular year
    for (size_t i = 0; i < 12; i++) {
      if (b <= month_len[i])
        break;
      b -= month_len[i];
      ++tmbuf->tm_mon;
    }
  } else {
    // leap year
    for (size_t i = 12; i < 24; i++) {
      if (b <= month_len[i])
        break;
      b -= month_len[i];
      ++tmbuf->tm_mon;
    }
  }
  tmbuf->tm_mday = b;
  return tmbuf;
}